

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateDictionary::SetEscapedFormattedValue
          (TemplateDictionary *this,TemplateString variable,TemplateModifier *escfn,char *format,...
          )

{
  TemplateString TVar1;
  TemplateString value;
  char *inlen;
  char *in;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_198 [24];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined4 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  TemplateString local_e8;
  char *local_c8;
  size_t sStack_c0;
  bool local_b8;
  undefined7 uStack_b7;
  TemplateId TStack_b0;
  allocator local_91;
  string local_90 [32];
  TemplateModifier local_70;
  string escaped_string;
  undefined1 local_48 [4];
  int buflen;
  va_list ap;
  char *scratch;
  char *buffer;
  char *format_local;
  TemplateModifier *escfn_local;
  TemplateDictionary *this_local;
  
  TVar1 = variable;
  if (in_AL != '\0') {
    local_168 = in_XMM0_Da;
    local_158 = in_XMM1_Da;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  buffer = format;
  format_local = (char *)escfn;
  escfn_local = (TemplateModifier *)this;
  ap[0].reg_save_area = UnsafeArena::Alloc(this->arena_,0x400);
  ap[0].overflow_arg_area = local_198;
  ap[0]._0_8_ = &stack0x00000028;
  buflen = 0x30;
  local_48 = (undefined1  [4])0x18;
  iVar2 = StringAppendV((char *)ap[0].reg_save_area,&scratch,buffer,(__va_list_tag *)local_48);
  in = format_local;
  inlen = scratch;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  TemplateModifier::operator()(&local_70,in,(size_t)inlen,(string *)(long)iVar2);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  UnsafeArena::Shrink(this->arena_,(char *)ap[0].reg_save_area,0);
  if ((scratch != (char *)ap[0].reg_save_area) && (scratch != (char *)0x0)) {
    operator_delete__(scratch);
  }
  local_c8 = variable.ptr_;
  sStack_c0 = variable.length_;
  local_b8 = variable.is_immutable_;
  uStack_b7 = variable._17_7_;
  variable.id_ = TVar1.id_;
  TStack_b0 = variable.id_;
  TemplateString::TemplateString(&local_e8,(string *)&local_70);
  TVar1.length_ = sStack_c0;
  TVar1.ptr_ = local_c8;
  TVar1.is_immutable_ = local_b8;
  TVar1._17_7_ = uStack_b7;
  TVar1.id_ = TStack_b0;
  value.length_ = local_e8.length_;
  value.ptr_ = local_e8.ptr_;
  value.is_immutable_ = local_e8.is_immutable_;
  value._17_7_ = local_e8._17_7_;
  value.id_ = local_e8.id_;
  SetValue(this,TVar1,value);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void TemplateDictionary::SetEscapedFormattedValue(TemplateString variable,
                                                  const TemplateModifier& escfn,
                                                  const char* format, ...) {
  char* buffer;

  char* scratch = arena_->Alloc(1024);  // StringAppendV requires >=1024 bytes
  va_list ap;
  va_start(ap, format);
  const int buflen = StringAppendV(scratch, &buffer, format, ap);
  va_end(ap);

  string escaped_string(escfn(buffer, buflen));
  // Reclaim the arena space: the value we care about is now in escaped_string
  arena_->Shrink(scratch, 0);   // reclaim arena space we didn't use
  if (buffer != scratch)
    delete[] buffer;

  SetValue(variable, escaped_string);
}